

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io__reader.cc
# Opt level: O1

void __thiscall
xemmai::io::t_reader::t_reader
          (t_reader *this,t_pvalue *a_stream,wstring_view a_encoding,size_t a_buffer)

{
  t_object *ptVar1;
  t_queue<128UL> *ptVar2;
  t_queue<256UL> *ptVar3;
  iconv_t pvVar4;
  t_object *ptVar5;
  long in_FS_OFFSET;
  wstring_view a_string;
  string local_48;
  
  a_string._M_str = a_encoding._M_str;
  (this->super_t_sharable).super_t_owned.v_owner = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__align = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 8) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x10) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x18) = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x20) = 0;
  (this->super_t_sharable).v_mutex._M_impl._M_rwlock.__data.__pad2 = 0;
  *(undefined8 *)((long)&(this->super_t_sharable).v_mutex._M_impl._M_rwlock + 0x30) = 0;
  a_string._M_len = (size_t)a_string._M_str;
  portable::f_convert_abi_cxx11_(&local_48,(portable *)a_encoding._M_len,a_string);
  pvVar4 = iconv_open("wchar_t",local_48._M_dataplus._M_p);
  (this->super_t_iconv).v_cd = pvVar4;
  if (pvVar4 != (iconv_t)0xffffffffffffffff) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    this->v_n0 = 0;
    (this->v_stream).v_p._M_b._M_p = (__pointer_type)0x0;
    (this->v_buffer).v_p._M_b._M_p = (__pointer_type)0x0;
    this->v_p1 = (char *)&this->v_c;
    this->v_n1 = 4;
    ptVar5 = (a_stream->super_t_pointer).v_p;
    if ((t_object *)0x4 < ptVar5) {
      ptVar2 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
      *ptVar2->v_head = ptVar5;
      if (ptVar2->v_head == ptVar2->v_next) {
        t_slot::t_queue<128UL>::f_next(ptVar2);
      }
      else {
        ptVar2->v_head = ptVar2->v_head + 1;
      }
    }
    LOCK();
    ptVar1 = (this->v_stream).v_p._M_b._M_p;
    (this->v_stream).v_p._M_b._M_p = ptVar5;
    UNLOCK();
    if ((t_object *)0x4 < ptVar1) {
      ptVar3 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
      *ptVar3->v_head = ptVar1;
      if (ptVar3->v_head == ptVar3->v_next) {
        t_slot::t_queue<256UL>::f_next(ptVar3);
      }
      else {
        ptVar3->v_head = ptVar3->v_head + 1;
      }
    }
    ptVar5 = t_bytes::f_instantiate(a_buffer + (a_buffer == 0));
    if ((t_object *)0x4 < ptVar5) {
      ptVar2 = *(t_queue<128UL> **)(in_FS_OFFSET + -0x68);
      *ptVar2->v_head = ptVar5;
      if (ptVar2->v_head == ptVar2->v_next) {
        t_slot::t_queue<128UL>::f_next(ptVar2);
      }
      else {
        ptVar2->v_head = ptVar2->v_head + 1;
      }
    }
    LOCK();
    ptVar1 = (this->v_buffer).v_p._M_b._M_p;
    (this->v_buffer).v_p._M_b._M_p = ptVar5;
    UNLOCK();
    if ((t_object *)0x4 < ptVar1) {
      ptVar3 = *(t_queue<256UL> **)(in_FS_OFFSET + -0x70);
      *ptVar3->v_head = ptVar1;
      if (ptVar3->v_head == ptVar3->v_next) {
        t_slot::t_queue<256UL>::f_next(ptVar3);
      }
      else {
        ptVar3->v_head = ptVar3->v_head + 1;
      }
    }
    return;
  }
  portable::f_throw_system_error();
}

Assistant:

t_reader::t_reader(const t_pvalue& a_stream, std::wstring_view a_encoding, size_t a_buffer) : t_iconv("wchar_t", portable::f_convert(a_encoding).c_str())
{
	v_stream = a_stream;
	v_buffer = t_bytes::f_instantiate(std::max(a_buffer, size_t(1)));
}